

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::SelectExpr,_std::default_delete<wabt::SelectExpr>_> __thiscall
wabt::MakeUnique<wabt::SelectExpr,std::vector<wabt::Type,std::allocator<wabt::Type>>>
          (wabt *this,vector<wabt::Type,_std::allocator<wabt::Type>_> *args)

{
  SelectExpr *this_00;
  Location local_50;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_30;
  vector<wabt::Type,_std::allocator<wabt::Type>_> *local_18;
  vector<wabt::Type,_std::allocator<wabt::Type>_> *args_local;
  
  local_18 = args;
  args_local = (vector<wabt::Type,_std::allocator<wabt::Type>_> *)this;
  this_00 = (SelectExpr *)operator_new(0x58);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_30,local_18);
  Location::Location(&local_50);
  SelectExpr::SelectExpr(this_00,&local_30,&local_50);
  std::unique_ptr<wabt::SelectExpr,std::default_delete<wabt::SelectExpr>>::
  unique_ptr<std::default_delete<wabt::SelectExpr>,void>
            ((unique_ptr<wabt::SelectExpr,std::default_delete<wabt::SelectExpr>> *)this,this_00);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_30);
  return (__uniq_ptr_data<wabt::SelectExpr,_std::default_delete<wabt::SelectExpr>,_true,_true>)
         (__uniq_ptr_data<wabt::SelectExpr,_std::default_delete<wabt::SelectExpr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}